

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_7::Validator::CheckBlockDeclaration
          (Validator *this,Location *loc,Opcode opcode,BlockDeclaration *decl)

{
  FuncSignature *pFVar1;
  BlockDeclaration *pBVar2;
  bool bVar3;
  Index IVar4;
  Result result;
  char *pcVar5;
  FuncType *pFVar6;
  FuncType *local_30;
  FuncType *func_type;
  BlockDeclaration *decl_local;
  Location *loc_local;
  Validator *this_local;
  Opcode opcode_local;
  
  func_type = (FuncType *)decl;
  decl_local = (BlockDeclaration *)loc;
  loc_local = (Location *)this;
  this_local._4_4_ = opcode.enum_;
  IVar4 = FuncSignature::GetNumParams(&decl->sig);
  if ((IVar4 != 0) &&
     (bVar3 = Features::multi_value_enabled(&this->options_->features), pBVar2 = decl_local, !bVar3)
     ) {
    pcVar5 = Opcode::GetName((Opcode *)((long)&this_local + 4));
    PrintError(this,(Location *)pBVar2,"%s params not currently supported.",pcVar5);
  }
  IVar4 = FuncSignature::GetNumResults((FuncSignature *)(func_type + 1));
  if ((1 < IVar4) &&
     (bVar3 = Features::multi_value_enabled(&this->options_->features), pBVar2 = decl_local, !bVar3)
     ) {
    pcVar5 = Opcode::GetName((Opcode *)((long)&this_local + 4));
    PrintError(this,(Location *)pBVar2,"multiple %s results not currently supported.",pcVar5);
  }
  if (((byte)(func_type->name)._M_dataplus & 1) != 0) {
    result = CheckFuncTypeVar(this,(Var *)&(func_type->name)._M_string_length,&local_30);
    bVar3 = Succeeded(result);
    pBVar2 = decl_local;
    if (bVar3) {
      pFVar6 = func_type + 1;
      pFVar1 = &local_30->sig;
      pcVar5 = Opcode::GetName((Opcode *)((long)&this_local + 4));
      CheckTypes(this,(Location *)pBVar2,(TypeVector *)((long)&(pFVar6->name).field_2 + 8),
                 &pFVar1->result_types,pcVar5,"result");
      pBVar2 = decl_local;
      pFVar6 = func_type + 1;
      pcVar5 = Opcode::GetName((Opcode *)((long)&this_local + 4));
      CheckTypes(this,(Location *)pBVar2,(TypeVector *)pFVar6,&(local_30->sig).param_types,pcVar5,
                 "argument");
    }
  }
  return;
}

Assistant:

void Validator::CheckBlockDeclaration(const Location* loc,
                                      Opcode opcode,
                                      const BlockDeclaration* decl) {
  if (decl->sig.GetNumParams() > 0 &&
      !options_.features.multi_value_enabled()) {
    PrintError(loc, "%s params not currently supported.", opcode.GetName());
  }
  if (decl->sig.GetNumResults() > 1 &&
      !options_.features.multi_value_enabled()) {
    PrintError(loc, "multiple %s results not currently supported.",
               opcode.GetName());
  }
  if (decl->has_func_type) {
    const FuncType* func_type;
    if (Succeeded(CheckFuncTypeVar(&decl->type_var, &func_type))) {
      CheckTypes(loc, decl->sig.result_types, func_type->sig.result_types,
                 opcode.GetName(), "result");
      CheckTypes(loc, decl->sig.param_types, func_type->sig.param_types,
                 opcode.GetName(), "argument");
    }
  }
}